

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_continue::translate
          (method_continue *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  statement_base *this_00;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  token_base *ptr;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffcc;
  statement_continue *in_stack_ffffffffffffffd0;
  token_base local_28 [2];
  
  this_00 = (statement_base *)statement_base::operator_new(in_stack_ffffffffffffffb0);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
  ptr = local_28;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)this_00,in_stack_ffffffffffffffa8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)ptr);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)ptr);
  statement_continue::statement_continue
            (in_stack_ffffffffffffffd0,(context_t *)CONCAT44(in_stack_ffffffffffffffcc,uVar1),ptr);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1b93d5);
  return this_00;
}

Assistant:

statement_base *
	method_continue::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		return new statement_continue(context, raw.front().back());
	}